

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodule.c
# Opt level: O0

int xmlModuleClose(xmlModulePtr module)

{
  int iVar1;
  int rc;
  xmlModulePtr module_local;
  
  if (module == (xmlModulePtr)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,0x1a,0x1325,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                    (char *)0x0,0,0,"null module pointer\n");
    module_local._4_4_ = -1;
  }
  else {
    iVar1 = xmlModulePlatformClose(module->handle);
    if (iVar1 == 0) {
      module_local._4_4_ = xmlModuleFree(module);
    }
    else {
      __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                      (void *)0x0,0x1a,0x1325,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,
                      (char *)module->name,(char *)0x0,0,0,"failed to close: %s\n",module->name);
      module_local._4_4_ = -2;
    }
  }
  return module_local._4_4_;
}

Assistant:

int
xmlModuleClose(xmlModulePtr module)
{
    int rc;

    if (NULL == module) {
        __xmlRaiseError(NULL, NULL, NULL, NULL, NULL, XML_FROM_MODULE,
                        XML_MODULE_CLOSE, XML_ERR_FATAL, NULL, 0, 0,
                        NULL, NULL, 0, 0, "null module pointer\n");
        return -1;
    }

    rc = xmlModulePlatformClose(module->handle);

    if (rc != 0) {
        __xmlRaiseError(NULL, NULL, NULL, NULL, NULL, XML_FROM_MODULE,
                        XML_MODULE_CLOSE, XML_ERR_FATAL, NULL, 0, 0,
                        (const char *) module->name, NULL, 0, 0,
                        "failed to close: %s\n", module->name);
        return -2;
    }

    rc = xmlModuleFree(module);
    return (rc);
}